

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall CPlayer::TryRespawn(CPlayer *this)

{
  bool bVar1;
  CCharacter *pCVar2;
  CGameContext *pPlayer;
  CPlayer *in_RDI;
  long in_FS_OFFSET;
  vec2 SpawnPos;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vec2 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  IGameController *in_stack_ffffffffffffffb0;
  vec2 in_stack_ffffffffffffffc8;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  vector2_base<float>::vector2_base(&local_10);
  GameServer(in_RDI);
  bVar1 = IGameController::CanSpawn
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     (vec2 *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    in_RDI->m_Spawning = false;
    pCVar2 = (CCharacter *)
             CCharacter::operator_new((size_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    pPlayer = GameServer(in_RDI);
    CCharacter::CCharacter((CCharacter *)in_RDI,(CGameWorld *)pPlayer);
    in_RDI->m_pCharacter = pCVar2;
    CCharacter::Spawn((CCharacter *)in_RDI,(CPlayer *)pPlayer,in_stack_ffffffffffffffc8);
    GameServer(in_RDI);
    CGameContext::CreatePlayerSpawn
              ((CGameContext *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CPlayer::TryRespawn()
{
	vec2 SpawnPos;

	if(!GameServer()->m_pController->CanSpawn(m_Team, &SpawnPos))
		return;

	m_Spawning = false;
	m_pCharacter = new(m_ClientID) CCharacter(&GameServer()->m_World);
	m_pCharacter->Spawn(this, SpawnPos);
	GameServer()->CreatePlayerSpawn(SpawnPos);
}